

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceManager::selectedPostCalculation(ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  pointer ppFVar1;
  Snapshot *this_00;
  Mat3x3d *this_01;
  RigidBody *pRVar2;
  pointer ppRVar3;
  ForceModifier **forceModifier;
  pointer ppFVar4;
  Mat3x3d rbTau;
  RectMatrix<double,_3U,_3U> RStack_78;
  
  ppFVar1 = (this->forceModifiers_).
            super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar4 = (this->forceModifiers_).
                 super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar1;
      ppFVar4 = ppFVar4 + 1) {
    (*(*ppFVar4)->_vptr_ForceModifier[2])();
  }
  ppRVar3 = (mol1->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar3 ==
      (mol1->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar2 = (RigidBody *)0x0;
  }
  else {
    pRVar2 = *ppRVar3;
  }
  this_00 = this->info_->sman_->currentSnapshot_;
  this_01 = &this->virialTensor;
  while (ppRVar3 = ppRVar3 + 1, pRVar2 != (RigidBody *)0x0) {
    RigidBody::calcForcesAndTorquesAndVirial((Mat3x3d *)&RStack_78,pRVar2);
    RectMatrix<double,_3U,_3U>::add((RectMatrix<double,_3U,_3U> *)this_01,&RStack_78);
    if (ppRVar3 ==
        (mol1->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar2 = (RigidBody *)0x0;
    }
    else {
      pRVar2 = *ppRVar3;
    }
  }
  ppRVar3 = (mol2->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar3 !=
      (mol2->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_00181e80;
  pRVar2 = (RigidBody *)0x0;
  while (pRVar2 != (RigidBody *)0x0) {
    RigidBody::calcForcesAndTorquesAndVirial((Mat3x3d *)&RStack_78,pRVar2);
    RectMatrix<double,_3U,_3U>::add((RectMatrix<double,_3U,_3U> *)this_01,&RStack_78);
    ppRVar3 = ppRVar3 + 1;
    pRVar2 = (RigidBody *)0x0;
    if (ppRVar3 !=
        (mol2->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00181e80:
      pRVar2 = *ppRVar3;
    }
  }
  Snapshot::setVirialTensor(this_00,this_01);
  return;
}

Assistant:

void ForceManager::selectedPostCalculation(Molecule* mol1, Molecule* mol2) {
    for (auto& forceModifier : forceModifiers_)
      forceModifier->modifyForces();

    // Modify the rigid bodies in response to the applied force
    // modifications
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    // Collect the atomic forces onto rigid bodies
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      Mat3x3d rbTau = rb->calcForcesAndTorquesAndVirial();
      virialTensor += rbTau;
    }

    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      Mat3x3d rbTau = rb->calcForcesAndTorquesAndVirial();
      virialTensor += rbTau;
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, virialTensor.getArrayPointer(), 9, MPI_REALTYPE,
                  MPI_SUM, MPI_COMM_WORLD);
#endif
    curSnapshot->setVirialTensor(virialTensor);

    /*
      if (info_->getSimParams()->getUseLongRangeCorrections()) {

        RealType vol = curSnapshot->getVolume();
        RealType Elrc(0.0);
        RealType Wlrc(0.0);

        AtomTypeSet::iterator i;
        AtomTypeSet::iterator j;

        RealType n_i, n_j;
        RealType rho_i, rho_j;
        pair<RealType, RealType> LRI;

        for (i = atomTypes_.begin(); i != atomTypes_.end(); ++i) {
        n_i = RealType(info_->getGlobalCountOfType(*i));
        rho_i = n_i /  vol;
        for (j = atomTypes_.begin(); j != atomTypes_.end(); ++j) {
        n_j = RealType(info_->getGlobalCountOfType(*j));
        rho_j = n_j / vol;

        LRI = interactionMan_->getLongRangeIntegrals( (*i), (*j) );

        Elrc += n_i   * rho_j * LRI.first;
        Wlrc -= rho_i * rho_j * LRI.second;
        }
        }
        Elrc *= 2.0 * Constants::PI;
        Wlrc *= 2.0 * Constants::PI;

        RealType lrp = curSnapshot->getLongRangePotential();
        curSnapshot->setLongRangePotential(lrp + Elrc);
        virialTensor += Wlrc * SquareMatrix3<RealType>::identity();
        curSnapshot->setVirialTensor(virialTensor);
      }
    */
  }